

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

void __thiscall
slang::ast::ForLoopStatement::serializeTo(ForLoopStatement *this,ASTSerializer *serializer)

{
  size_type sVar1;
  pointer ppEVar2;
  long lVar3;
  string_view name;
  string_view name_00;
  
  name._M_str = "initializers";
  name._M_len = 0xc;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->initializers).size_;
  if (sVar1 != 0) {
    ppEVar2 = (this->initializers).data_;
    lVar3 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar3));
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  if (this->stopExpr != (Expression *)0x0) {
    ASTSerializer::write(serializer,8,"stopExpr",(size_t)this->stopExpr);
  }
  name_00._M_str = "steps";
  name_00._M_len = 5;
  ASTSerializer::startArray(serializer,name_00);
  sVar1 = (this->steps).size_;
  if (sVar1 != 0) {
    ppEVar2 = (this->steps).data_;
    lVar3 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar3));
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  ASTSerializer::write(serializer,4,"body",(size_t)this->body);
  return;
}

Assistant:

void ForLoopStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("initializers");
    for (auto ini : initializers) {
        serializer.serialize(*ini);
    }
    serializer.endArray();

    if (stopExpr)
        serializer.write("stopExpr", *stopExpr);

    serializer.startArray("steps");
    for (auto step : steps) {
        serializer.serialize(*step);
    }
    serializer.endArray();

    serializer.write("body", body);
}